

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CConsole::Print(CConsole *this,int Level,char *pFrom,char *pStr,bool Highlighted)

{
  int iVar1;
  void **ppvVar2;
  long lVar3;
  long in_FS_OFFSET;
  char aBuf [1024];
  char aTimeBuf [80];
  char acStack_488 [1024];
  char local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str_timestamp_format(local_88,0x50,"%H:%M:%S");
  str_format(acStack_488,0x400,"[%s][%s]: %s",local_88,pFrom,pStr);
  dbg_msg(pFrom,"%s",pStr);
  iVar1 = this->m_NumPrintCB;
  if (0 < iVar1) {
    ppvVar2 = &this->m_aPrintCB[0].m_pPrintCallbackUserdata;
    lVar3 = 0;
    do {
      if ((Level <= ((anon_struct_24_3_da75e937 *)(ppvVar2 + -2))->m_OutputLevel) &&
         ((FPrintCallback)ppvVar2[-1] != (FPrintCallback)0x0)) {
        (*(code *)ppvVar2[-1])(acStack_488,*ppvVar2,Highlighted);
        iVar1 = this->m_NumPrintCB;
      }
      lVar3 = lVar3 + 1;
      ppvVar2 = ppvVar2 + 3;
    } while (lVar3 < iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Print(int Level, const char *pFrom, const char *pStr, bool Highlighted)
{
	char aTimeBuf[80];
	str_timestamp_format(aTimeBuf, sizeof(aTimeBuf), FORMAT_TIME);

	char aBuf[1024];
	str_format(aBuf, sizeof(aBuf), "[%s][%s]: %s", aTimeBuf, pFrom, pStr);
	dbg_msg(pFrom ,"%s", pStr);
	for(int i = 0; i < m_NumPrintCB; ++i)
	{
		if(Level <= m_aPrintCB[i].m_OutputLevel && m_aPrintCB[i].m_pfnPrintCallback)
		{
			m_aPrintCB[i].m_pfnPrintCallback(aBuf, m_aPrintCB[i].m_pPrintCallbackUserdata, Highlighted);
		}
	}
}